

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

Entry * __thiscall
Lib::
DHMap<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
::findEntry(DHMap<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
            *this,pair<Kernel::TermSpec,_Kernel::TermSpec> *key)

{
  uint uVar1;
  uint uVar2;
  Entry *pEVar3;
  Entry *pEVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  if (this->_capacity == 0) {
    pEVar4 = (Entry *)0x0;
  }
  else {
    uVar1 = DefaultHash::hash<Kernel::TermSpec,Kernel::TermSpec>(key);
    uVar5 = (ulong)uVar1 % (ulong)(uint)this->_capacity;
    uVar1 = this->_entries[uVar5].field_0._infoData;
    pEVar4 = (Entry *)0x0;
    if (uVar1 >> 2 == this->_timestamp) {
      pEVar3 = this->_entries + uVar5;
      if (((((pEVar3->_key).first.term._content == (key->first).term._content) &&
           ((pEVar3->_key).first.index == (key->first).index)) &&
          ((pEVar3->_key).second.term._content == (key->second).term._content)) &&
         ((pEVar3->_key).second.index == (key->second).index)) {
        pEVar4 = (Entry *)0x0;
        if ((uVar1 & 1) == 0) {
          pEVar4 = pEVar3;
        }
      }
      else if ((uVar1 & 2) == 0) {
        pEVar4 = (Entry *)0x0;
      }
      else {
        uVar2 = DefaultHash2::hash<Kernel::TermSpec,Kernel::TermSpec>(key);
        uVar1 = this->_capacity;
        iVar6 = uVar2 % uVar1 + (uint)(uVar2 % uVar1 == 0);
        pEVar3 = this->_entries;
        uVar5 = (ulong)(uint)((int)uVar5 + iVar6) % (ulong)uVar1;
        pEVar4 = pEVar3 + uVar5;
        uVar2 = pEVar3[uVar5].field_0._infoData;
        bVar7 = uVar2 >> 2 == this->_timestamp;
        if (bVar7) {
          do {
            if ((((pEVar4->_key).first.term._content == (key->first).term._content) &&
                ((pEVar4->_key).first.index == (key->first).index)) &&
               (((pEVar4->_key).second.term._content == (key->second).term._content &&
                ((pEVar4->_key).second.index == (key->second).index)))) break;
            uVar5 = (ulong)(uint)((int)uVar5 + iVar6) % (ulong)uVar1;
            pEVar4 = pEVar3 + uVar5;
            uVar2 = pEVar3[uVar5].field_0._infoData;
            bVar7 = uVar2 >> 2 == this->_timestamp;
          } while (bVar7);
        }
        if ((uVar2 & 1) != 0) {
          pEVar4 = (Entry *)0x0;
        }
        if (!bVar7) {
          pEVar4 = (Entry *)0x0;
        }
      }
    }
  }
  return pEVar4;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }